

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_manager.cpp
# Opt level: O2

void __thiscall
duckdb::MetadataManager::ConvertToTransient(MetadataManager *this,MetadataBlock *metadata_block)

{
  data_ptr_t __dest;
  data_ptr_t __src;
  idx_t __n;
  shared_ptr<duckdb::BlockHandle,_true> new_block;
  BufferHandle new_buffer;
  BufferHandle old_buffer;
  
  (*this->buffer_manager->_vptr_BufferManager[7])(&old_buffer,this->buffer_manager,metadata_block);
  (*this->buffer_manager->_vptr_BufferManager[5])
            (&new_buffer,this->buffer_manager,7,this->block_manager,0);
  ::std::__shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2> *)&new_block,
             (__shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2> *)&new_buffer);
  __dest = BufferHandle::Ptr(&new_buffer);
  __src = BufferHandle::Ptr(&old_buffer);
  __n = BlockManager::GetBlockSize(this->block_manager);
  switchD_016b45db::default(__dest,__src,__n);
  shared_ptr<duckdb::BlockHandle,_true>::operator=(&metadata_block->block,&new_block);
  BlockManager::UnregisterBlock(this->block_manager,metadata_block->block_id);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&new_block.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  BufferHandle::~BufferHandle(&new_buffer);
  BufferHandle::~BufferHandle(&old_buffer);
  return;
}

Assistant:

void MetadataManager::ConvertToTransient(MetadataBlock &metadata_block) {
	// pin the old block
	auto old_buffer = buffer_manager.Pin(metadata_block.block);

	// allocate a new transient block to replace it
	auto new_buffer = buffer_manager.Allocate(MemoryTag::METADATA, &block_manager, false);
	auto new_block = new_buffer.GetBlockHandle();

	// copy the data to the transient block
	memcpy(new_buffer.Ptr(), old_buffer.Ptr(), block_manager.GetBlockSize());
	metadata_block.block = std::move(new_block);

	// unregister the old block
	block_manager.UnregisterBlock(metadata_block.block_id);
}